

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O1

void sqstd_pushstringf(HSQUIRRELVM v,SQChar *s,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  char *__s;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar4;
  size_t __maxlen;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __maxlen = 0x100;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    local_f8 = local_e8;
    local_100 = &args[0].overflow_arg_area;
    local_108 = 0x3000000010;
    __s = (char *)sq_getscratchpad(v,__maxlen);
    iVar2 = vsnprintf(__s,__maxlen,s,&local_108);
    lVar4 = (long)iVar2;
    if (lVar4 < (long)__maxlen) {
      sVar3 = __maxlen;
      if (iVar2 < 0) {
        sq_pushnull(v);
      }
      else {
        sq_pushstring(v,__s,lVar4);
      }
    }
    else {
      sVar3 = lVar4 + 1;
    }
    bVar1 = (long)__maxlen <= lVar4;
    __maxlen = sVar3;
  } while (bVar1);
  return;
}

Assistant:

void sqstd_pushstringf(HSQUIRRELVM v,const SQChar *s,...)
{
    SQInteger n=256;
    va_list args;
begin:
    va_start(args,s);
    SQChar *b=sq_getscratchpad(v,n);
    SQInteger r=scvsprintf(b,n,s,args);
    va_end(args);
    if (r>=n) {
        n=r+1;//required+null
        goto begin;
    } else if (r<0) {
        sq_pushnull(v);
    } else {
        sq_pushstring(v,b,r);
    }
}